

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

Vector3f __thiscall
pbrt::PortalImageInfiniteLight::RenderFromImage
          (PortalImageInfiniteLight *this,Point2f *st,Float *duv_dw)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Tuple3<pbrt::Vector3,_float> TVar4;
  float *in_RDX;
  uint *in_RSI;
  int __x;
  Vector3<float> *in_RDI;
  float fVar5;
  double dVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Vector3<float> VVar10;
  Vector3f VVar11;
  Vector3f *in_stack_00000008;
  Frame *in_stack_00000010;
  Vector3f w;
  Float y;
  Float x;
  Float beta;
  Float alpha;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  Vector3<float> *in_stack_ffffffffffffff90;
  undefined1 local_50 [12];
  undefined8 local_44;
  float local_3c;
  undefined4 local_38;
  undefined4 local_34;
  uint local_30;
  uint local_2c;
  float *local_28;
  undefined1 auVar9 [56];
  
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40490fdb),0),ZEXT416(*in_RSI),
                           SUB6416(ZEXT464(0xbfc90fdb),0));
  local_2c = auVar2._0_4_;
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40490fdb),0),ZEXT416(in_RSI[1]),
                           SUB6416(ZEXT464(0xbfc90fdb),0));
  local_30 = auVar2._0_4_;
  local_28 = in_RDX;
  dVar6 = std::tan((double)(ulong)local_2c);
  local_34 = SUB84(dVar6,0);
  dVar6 = std::tan((double)(ulong)local_30);
  local_38 = SUB84(dVar6,0);
  auVar9 = (undefined1  [56])0x0;
  Vector3<float>::Vector3(in_RDI,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0.0);
  __x = (int)local_50;
  VVar10 = Normalize<float>(in_stack_ffffffffffffff90);
  local_3c = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar9;
  uVar1 = vmovlpd_avx(auVar7._0_16_);
  if ((local_3c == 0.0) && (!NAN(local_3c))) {
    local_3c = 1e-05;
  }
  local_44 = uVar1;
  if (local_28 != (float *)0x0) {
    local_44._4_4_ = (uint)((ulong)uVar1 >> 0x20);
    auVar2 = vfmadd213ss_fma(ZEXT416(local_44._4_4_),ZEXT416(local_44._4_4_ ^ 0x80000000),
                             SUB6416(ZEXT464(0x3f800000),0));
    local_44._0_4_ = (uint)uVar1;
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_44),ZEXT416((uint)local_44 ^ 0x80000000),
                             SUB6416(ZEXT464(0x3f800000),0));
    fVar5 = (auVar2._0_4_ * auVar3._0_4_) / local_3c;
    std::abs(__x);
    *local_28 = fVar5 * 9.869605;
  }
  auVar9 = (undefined1  [56])0x0;
  VVar11 = Frame::FromLocal(in_stack_00000010,in_stack_00000008);
  auVar8._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar9;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  TVar4.z = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
  TVar4.x = (float)(int)uVar1;
  TVar4.y = (float)(int)((ulong)uVar1 >> 0x20);
  return (Vector3f)TVar4;
}

Assistant:

PBRT_CPU_GPU
    Vector3f RenderFromImage(const Point2f &st, Float *duv_dw = nullptr) const {
        Float alpha = -Pi / 2 + st.x * Pi, beta = -Pi / 2 + st.y * Pi;
        Float x = std::tan(alpha), y = std::tan(beta);
        DCHECK(!IsInf(x) && !IsInf(y));
        Vector3f w = Normalize(Vector3f(x, y, -1));

        if (w.z == 0)
            w.z = 1e-5;
        if (duv_dw)
            *duv_dw = Pi * Pi * std::abs((1 - w.y * w.y) * (1 - w.x * w.x) / w.z);
        return portalFrame.FromLocal(w);
    }